

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Config::~Config(Config *this)

{
  Config *in_RDI;
  
  ~Config(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Config() = default;